

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ConditionalExpressionSyntax::setChild
          (ConditionalExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar2;
  SyntaxNode *pSVar3;
  logic_error *this_00;
  Token TVar4;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 6) {
    switch(index) {
    case 0:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p =
             (pointer)SyntaxNode::as<slang::syntax::ConditionalPredicateSyntax>(pSVar3);
      }
      not_null<slang::syntax::ConditionalPredicateSyntax*>::
      not_null<slang::syntax::ConditionalPredicateSyntax*,void>
                ((not_null<slang::syntax::ConditionalPredicateSyntax*> *)&local_b8,
                 (ConditionalPredicateSyntax **)&local_d8);
      (this->predicate).ptr = (ConditionalPredicateSyntax *)local_b8._M_dataplus._M_p;
      break;
    case 1:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->question).kind = TVar4.kind;
      (this->question).field_0x2 = TVar4._2_1_;
      (this->question).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->question).rawLen = TVar4.rawLen;
      (this->question).info = TVar4.info;
      break;
    case 2:
      pSVar3 = TokenOrSyntax::node(&child);
      pSVar2 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                         (pSVar3);
      (this->attributes).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->attributes).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->attributes).super_SyntaxListBase.childCount = (pSVar2->super_SyntaxListBase).childCount
      ;
      sVar1 = (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
              .size_;
      (this->attributes).
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
           data_;
      (this->attributes).
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 3:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p = (pointer)SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar3)
        ;
      }
      not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
                ((not_null<slang::syntax::ExpressionSyntax*> *)&local_b8,
                 (ExpressionSyntax **)&local_d8);
      (this->left).ptr = (ExpressionSyntax *)local_b8._M_dataplus._M_p;
      break;
    case 4:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->colon).kind = TVar4.kind;
      (this->colon).field_0x2 = TVar4._2_1_;
      (this->colon).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->colon).rawLen = TVar4.rawLen;
      (this->colon).info = TVar4.info;
      break;
    case 5:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p = (pointer)SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar3)
        ;
      }
      not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
                ((not_null<slang::syntax::ExpressionSyntax*> *)&local_b8,
                 (ExpressionSyntax **)&local_d8);
      (this->right).ptr = (ExpressionSyntax *)local_b8._M_dataplus._M_p;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_58,&local_78,":");
  std::__cxx11::to_string(&local_98,0xa45);
  std::operator+(&local_38,&local_58,&local_98);
  std::operator+(&local_d8,&local_38,": ");
  std::operator+(&local_b8,&local_d8,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_b8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void ConditionalExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: predicate = child.node() ? &child.node()->as<ConditionalPredicateSyntax>() : nullptr; return;
        case 1: question = child.token(); return;
        case 2: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 3: left = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 4: colon = child.token(); return;
        case 5: right = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}